

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O1

int polymon(int mntmp)

{
  byte *pbVar1;
  char cVar2;
  obj *poVar3;
  boolean bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  permonst *ppVar15;
  char *pcVar16;
  int iVar17;
  int tmp;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  char hornbuf [256];
  char local_238 [256];
  char local_138 [264];
  
  bVar4 = sticks(youmonst.data);
  bVar12 = 1;
  if ((bVar4 != '\0') && (u.ustuck != (monst *)0x0)) {
    bVar12 = u._1052_1_ & 1;
  }
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar19 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      bVar19 = false;
    }
    else {
      bVar19 = ublindf->oartifact == '\x1d';
    }
  }
  if (u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) {
    bVar20 = ((youmonst.data)->mflags1 & 8) == 0;
  }
  else {
    bVar20 = false;
  }
  if ((mvitals[mntmp].mvflags & 2) != 0) {
    pcVar8 = mons_mname(mons + mntmp);
    pline("You feel rather %s-ish.",pcVar8);
    exercise(2,'\x01');
    return 0;
  }
  u.uconduct.polyselfs = u.uconduct.polyselfs + 1;
  if (u.umonnum == u.umonster) {
    u._1052_1_ = u._1052_1_ & 0xf7 | (flags.female & 1U) << 3;
  }
  else {
    u.acurr.a[4] = u.macurr.a[4];
    u.acurr.a[5] = u.macurr.a[5];
    u.acurr.a[0] = u.macurr.a[0];
    u.acurr.a[1] = u.macurr.a[1];
    u.acurr.a[2] = u.macurr.a[2];
    u.acurr.a[3] = u.macurr.a[3];
    u.amax.a[0] = u.mamax.a[0];
    u.amax.a[1] = u.mamax.a[1];
    u.amax.a[2] = u.mamax.a[2];
    u.amax.a[3] = u.mamax.a[3];
    u.amax.a[4] = u.mamax.a[4];
    u.amax.a[5] = u.mamax.a[5];
    flags.female = (byte)u._1052_1_ >> 3 & 1;
  }
  u.macurr.a._0_4_ = u.acurr.a._0_4_;
  u.macurr.a._4_2_ = u.acurr.a._4_2_;
  u.mamax.a._0_4_ = u.amax.a._0_4_;
  u.mamax.a._4_2_ = u.amax.a._4_2_;
  if (youmonst.m_ap_type == '\0') {
    if (mons[mntmp].mlet != '\r') {
      youmonst.m_ap_type = '\0';
    }
  }
  else if (multi < 0) {
    unmul("");
  }
  ppVar15 = mons + mntmp;
  uVar7 = mons[mntmp].mflags2;
  if ((uVar7 >> 0x10 & 1) == 0) {
    if ((uVar7 >> 0x11 & 1) != 0) {
      bVar18 = flags.female != '\0';
      goto LAB_0021756b;
    }
    if (((uVar7 >> 0x12 & 1) == 0) && (u.ulycn != mntmp)) {
      uVar6 = mt_random();
      bVar18 = 0x19999999 <
               (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f);
      goto LAB_0021756b;
    }
LAB_0021756f:
    iVar17 = u.umonnum;
    pcVar8 = mons_mname(ppVar15);
    if (iVar17 == mntmp) {
      pcVar16 = "You feel like a new %s!";
    }
    else {
      pcVar8 = an(pcVar8);
      pcVar16 = "You turn into %s!";
    }
    pline(pcVar16,pcVar8);
  }
  else {
    bVar18 = flags.female == '\0';
LAB_0021756b:
    if (bVar18) goto LAB_0021756f;
    pcVar8 = "turn into a";
    if (u.umonnum == mntmp) {
      pcVar8 = "feel like a new";
    }
    flags.female = flags.female == '\0';
    pcVar16 = "male ";
    if ((bool)flags.female) {
      pcVar16 = "female ";
    }
    pcVar10 = "";
    if ((uVar7 & 0x30000) == 0) {
      pcVar10 = pcVar16;
    }
    pcVar16 = mons_mname(ppVar15);
    pline("You %s %s%s!",pcVar8,pcVar10,pcVar16);
  }
  if ((u.uprops[0x21].intrinsic != 0) && (bVar4 = poly_when_stoned(ppVar15), bVar4 != '\0')) {
    pline("You turn to stone!");
    u.uprops[0x21].intrinsic = 0;
    delayed_killer = (char *)0x0;
    mntmp = 0x108;
  }
  uVar7 = mt_random();
  u.mtimedone = uVar7 % 500 + 500;
  ppVar15 = mons + mntmp;
  if (mntmp == u.umonster) {
    ppVar15 = &upermonst;
  }
  u.umonnum = mntmp;
  set_mon_data(&youmonst,ppVar15,0);
  if ((mons[mntmp].mflags2 & 0x4000000) != 0) {
    u.amax.a[0] = 'v';
    u.acurr.a[0] = 'v';
  }
  if (((u.uprops[8].extrinsic != 0) || (((byte)youmonst.mintrinsics & 0x80) != 0)) &&
     (u.uprops[0x21].intrinsic != 0)) {
    u.uprops[0x21].intrinsic = 0;
    delayed_killer = (char *)0x0;
    pline("You no longer seem to be petrifying.");
  }
  if ((((u.uprops[0x34].intrinsic != 0) ||
       (youmonst.data == mons + 0xfd || (youmonst.data)->mlet == ' ')) ||
      (bVar4 = defends(0x21,uwep), bVar4 != '\0')) && (u.uprops[0x1d].intrinsic != 0)) {
    make_sick(0,(char *)0x0,'\0',3);
    pline("You no longer feel sick.");
  }
  if (u.uprops[0x3a].intrinsic != 0) {
    if ((youmonst.data == mons + 0x157 || youmonst.data == mons + 0xa0) ||
        (youmonst.data == mons + 0x20 || youmonst.data == mons + 0x73)) {
      pline("The slime burns away!");
    }
    else if (mntmp != 0xd7) goto LAB_00217826;
    u.uprops[0x3a].intrinsic = 0;
    iflags.botl = '\x01';
  }
LAB_00217826:
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    u.uprops[0x29].intrinsic = 0;
  }
  cVar2 = mons[mntmp].mlevel;
  iVar17 = (int)cVar2;
  if (mntmp < 0x93 || (youmonst.data)->mlet != '\x1e') {
    if ((youmonst.data)->mlet == '7') {
      u.mhmax = golemhp(mntmp);
    }
    else {
      iVar13 = iVar17;
      iVar14 = iVar17;
      if (cVar2 == '\0') {
        uVar7 = mt_random();
        iVar13 = (uVar7 & 3) + 1;
      }
      else {
        do {
          uVar7 = mt_random();
          iVar13 = iVar13 + (uVar7 & 7);
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      u.mhmax = iVar13;
      bVar4 = is_home_elemental(&u.uz,mons + mntmp);
      if (bVar4 != '\0') {
        u.mhmax = u.mhmax * 3;
      }
    }
  }
  else if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
    u.mhmax = iVar17 * 8;
  }
  else {
    iVar13 = iVar17;
    iVar14 = iVar17;
    if (cVar2 != '\0') {
      do {
        uVar7 = mt_random();
        iVar13 = iVar13 + (uVar7 & 3);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    u.mhmax = iVar13 + iVar17 * 4;
  }
  u.mh = u.mhmax;
  if (u.ulevel < iVar17) {
    u.mtimedone = (u.ulevel * u.mtimedone) / iVar17;
  }
  if ((uskin != (obj *)0x0) && (iVar17 = armor_to_dragon((int)uskin->otyp), mntmp != iVar17)) {
    pline("Your skin returns to its original form.");
    poVar3 = uskin;
    uarm = uskin;
    uskin = (obj *)0x0;
    pbVar1 = (byte *)((long)&poVar3->owornmask + 3);
    *pbVar1 = *pbVar1 & 0xef;
  }
  bVar4 = breakarm(youmonst.data);
  poVar3 = uarm;
  if (bVar4 == '\0') {
    bVar4 = sliparm(youmonst.data);
    poVar3 = uarm;
    if (bVar4 != '\0') {
      if ((uarm != (obj *)0x0) && (iVar17 = racial_exception(&youmonst,uarm), iVar17 < 1)) {
        bVar4 = donning(poVar3);
        if (bVar4 != '\0') {
          cancel_don();
        }
        pline("Your armor falls around you!");
        Armor_gone('\0');
        dropx(poVar3);
      }
      poVar3 = uarmc;
      ppVar15 = youmonst.data;
      if (uarmc != (obj *)0x0) {
        cVar2 = (youmonst.data)->mlet;
        pcVar8 = cloak_simple_name(uarmc);
        pcVar16 = "You shrink out of your %s!";
        if (ppVar15 == mons + 0x9f) {
          pcVar16 = "Your %s falls, unsupported!";
        }
        if (cVar2 == '\x16') {
          pcVar16 = "Your %s falls, unsupported!";
        }
        pline(pcVar16,pcVar8);
        Cloak_off();
        dropx(poVar3);
      }
      poVar3 = uarmu;
      if (uarmu != (obj *)0x0) {
        pcVar8 = "You become much too small for your shirt!";
        if (youmonst.data == mons + 0x9f) {
          pcVar8 = "You seep right through your shirt!";
        }
        if ((youmonst.data)->mlet == '\x16') {
          pcVar8 = "You seep right through your shirt!";
        }
        pline(pcVar8);
        setworn((obj *)0x0,(ulong)(poVar3->owornmask & 0x40));
        dropx(poVar3);
      }
    }
  }
  else {
    if (uarm != (obj *)0x0) {
      bVar4 = donning(uarm);
      if (bVar4 != '\0') {
        cancel_don();
      }
      pline("You break out of your armor!");
      exercise(0,'\0');
      Armor_gone('\0');
      useup(poVar3);
    }
    poVar3 = uarmc;
    if (uarmc != (obj *)0x0) {
      cVar2 = uarmc->oartifact;
      pcVar8 = cloak_simple_name(uarmc);
      if (cVar2 == '\0') {
        pline("Your %s tears apart!",pcVar8);
        Cloak_off();
        useup(poVar3);
      }
      else {
        pline("Your %s falls off!",pcVar8);
        Cloak_off();
        dropx(poVar3);
      }
    }
    if (uarmu != (obj *)0x0) {
      pline("Your shirt rips to shreds!");
      useup(uarmu);
    }
  }
  iVar17 = num_horns(youmonst.data);
  poVar3 = uarmh;
  if ((0 < iVar17) && (uarmh != (obj *)0x0)) {
    if ((((long)uarmh->otyp == 0x3d) || ((*(ushort *)&objects[uarmh->otyp].field_0x11 & 0x180) == 0)
        ) && (bVar4 = donning(uarmh), bVar4 == '\0')) {
      iVar17 = num_horns(youmonst.data);
      pcVar8 = "s";
      if (iVar17 == 1) {
        pcVar8 = "";
      }
      sprintf(local_238,"horn%s",pcVar8);
      pcVar8 = vtense(local_238,"pierce");
      pcVar16 = shk_your(local_138,poVar3);
      pcVar10 = xname(poVar3);
      pline("Your %s %s through %s %s.",local_238,pcVar8,pcVar16,pcVar10);
    }
    else {
      bVar4 = donning(poVar3);
      if (bVar4 != '\0') {
        cancel_don();
      }
      pcVar8 = surface((int)u.ux,(int)u.uy);
      pline("Your helmet falls to the %s!",pcVar8);
      Helmet_off();
      dropx(poVar3);
    }
  }
  poVar3 = uarmg;
  if ((((youmonst.data)->mflags1 & 0x2000) != 0) || ((youmonst.data)->msize == '\0')) {
    if (uarmg != (obj *)0x0) {
      bVar4 = donning(uarmg);
      if (bVar4 != '\0') {
        cancel_don();
      }
      pcVar8 = " and weapon";
      if (uwep == (obj *)0x0) {
        pcVar8 = "";
      }
      pline("You drop your gloves%s!",pcVar8);
      drop_weapon(0);
      Gloves_off();
      dropx(poVar3);
    }
    poVar3 = uarms;
    if (uarms != (obj *)0x0) {
      pline("You can no longer hold your shield!");
      Shield_off();
      dropx(poVar3);
    }
    poVar3 = uarmh;
    if (uarmh != (obj *)0x0) {
      bVar4 = donning(uarmh);
      if (bVar4 != '\0') {
        cancel_don();
      }
      pcVar8 = surface((int)u.ux,(int)u.uy);
      pline("Your helmet falls to the %s!",pcVar8);
      Helmet_off();
      dropx(poVar3);
    }
  }
  poVar3 = uarmf;
  if (((((((youmonst.data)->mflags1 >> 0xd & 1) != 0) ||
        (((youmonst.data)->mflags1 >> 0x13 & 1) != 0)) || ((youmonst.data)->msize == '\0')) ||
      ((youmonst.data)->mlet == '\x1d')) && (uarmf != (obj *)0x0)) {
    bVar4 = donning(uarmf);
    if (bVar4 != '\0') {
      cancel_don();
    }
    if (youmonst.data == mons + 0x9f || (youmonst.data)->mlet == '\x16') {
      pline("Your boots fall away!");
    }
    else {
      pcVar8 = "are pushed";
      if ((youmonst.data)->msize == '\0') {
        pcVar8 = "slide";
      }
      pline("Your boots %s off your feet!",pcVar8);
    }
    Boots_off();
    dropx(poVar3);
  }
  drop_weapon(1);
  if (((youmonst.data)->mflags1 & 0x80) == 0) {
    if ((youmonst.data)->mlet == '9') {
      bVar5 = is_pool(level,(int)u.ux,(int)u.uy);
      bVar18 = (bool)(bVar5 & 1);
      goto LAB_00217e38;
    }
    u._1052_1_ = u._1052_1_ & 0xfb;
  }
  else {
    bVar18 = level->objects[u.ux][u.uy] != (obj *)0x0;
LAB_00217e38:
    u._1052_1_ = u._1052_1_ & 0xfb | bVar18 << 2;
  }
  if (u.utraptype == 1) {
    if ((u.uprops[0x3e].extrinsic != 0 || (u.uprops[0x3e].intrinsic != 0 || bVar20)) ||
       (((youmonst.data)->mflags1 & 8) != 0)) {
      if ((!bVar20) ||
         ((uVar7 = 0, u.uprops[0x3e].intrinsic == 0 && u.uprops[0x3e].extrinsic == 0 &&
          (((youmonst.data)->mflags1 & 8) == 0)))) goto LAB_00217ec7;
    }
    else {
      uVar7 = mt_random();
      uVar7 = uVar7 % 6 + 2;
    }
    u.utrap = uVar7;
  }
LAB_00217ec7:
  if ((!bVar19) &&
     (((u.uprops[0x1e].intrinsic == 0 &&
       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
    u.uprops[0x1e].intrinsic = 1;
    make_blinded(0,'\x01');
  }
  newsym((int)u.ux,(int)u.uy);
  if (bVar12 == 0) {
LAB_00217f66:
    bVar4 = sticks(youmonst.data);
    if (bVar4 == '\0') {
      Monnam(u.ustuck);
      pline("%s is no longer in your clutches.");
LAB_00217f91:
      u.ustuck = (monst *)0x0;
      u._1052_1_ = u._1052_1_ & 0x7f;
    }
  }
  else {
    if ((((u._1052_1_ & 1) == 0) && (u.ustuck != (monst *)0x0)) &&
       (bVar4 = sticks(youmonst.data), bVar4 != '\0')) goto LAB_00217f91;
    if (bVar12 == 0) goto LAB_00217f66;
  }
  if (u.usteed != (monst *)0x0) {
    if (((((u.usteed)->data == mons + 0xc) || ((u.usteed)->data == mons + 0xb)) &&
        (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) {
      uVar7 = mt_random();
      uVar7 = uVar7 % 3;
      lVar11 = (long)u.uluck;
      lVar9 = (long)u.moreluck;
      if ((int)(lVar9 + lVar11) != 0) {
        uVar6 = mt_random();
        if (SUB168(ZEXT416(uVar6) % SEXT816(0x32 - (lVar9 + lVar11)),0) != 0) {
          iVar13 = (int)u.moreluck + (int)u.uluck;
          iVar17 = iVar13 / 3;
          if (iVar13 < -5) {
            iVar17 = iVar13;
          }
          uVar6 = uVar7 - iVar17;
          uVar7 = 0;
          if ((-1 < (int)uVar6) && (uVar7 = 2, (int)uVar6 < 2)) {
            uVar7 = uVar6;
          }
        }
      }
      if (uVar7 != 0) {
        pcVar8 = mon_nam(u.usteed);
        pline("No longer petrifying-resistant, you touch %s.",pcVar8);
        pcVar8 = mons_mname((u.usteed)->data);
        pcVar8 = an(pcVar8);
        sprintf(local_238,"riding %s",pcVar8);
        bVar4 = delayed_petrify((char *)0x0,local_238);
        if (bVar4 != '\0') {
          dismount_steed(1);
        }
      }
    }
    if ((u.usteed != (monst *)0x0) && (bVar4 = can_ride(u.usteed), bVar4 == '\0')) {
      dismount_steed(3);
    }
  }
  if (flags.verbose != '\0') {
    bVar4 = attacktype(youmonst.data,0xc);
    if (bVar4 != '\0') {
      pline("Use the command #%s to %s.","monster","use your breath weapon");
    }
    bVar4 = attacktype(youmonst.data,10);
    if (bVar4 != '\0') {
      pline("Use the command #%s to %s.","monster","spit venom");
    }
    if ((youmonst.data)->mlet == '\x0e') {
      pline("Use the command #%s to %s.","monster","remove an iron ball");
    }
    bVar4 = attacktype(youmonst.data,0xf);
    if (bVar4 != '\0') {
      pline("Use the command #%s to %s.","monster","gaze at monsters");
    }
    if (((youmonst.data)->mflags1 & 0x100) != 0) {
      pline("Use the command #%s to %s.","monster","hide");
    }
    if (((youmonst.data)->mflags2 & 4) != 0) {
      pline("Use the command #%s to %s.","monster","summon help");
    }
    if (youmonst.data == mons + 100 || youmonst.data == mons + 0x62) {
      pline("Use the command #%s to %s.","monster","spin a web");
    }
    if (u.umonnum == 0x29) {
      pline("Use the command #%s to %s.","monster","multiply in a fountain");
    }
    if (((youmonst.data)->mlet == '\x15') && (((youmonst.data)->mflags2 & 0x20000000) != 0)) {
      pline("Use the command #%s to %s.","monster","use your horn");
    }
    if (youmonst.data == mons + 0x32 || youmonst.data == mons + 0x31) {
      pline("Use the command #%s to %s.","monster","emit a mental blast");
    }
    if ((youmonst.data)->msound == '\x0f') {
      pline("Use the command #%s to %s.","monster","shriek");
    }
    if ((((youmonst.data)->mflags1 & 0x400000) != 0) && (flags.female != '\0')) {
      pline("Use the command #%s to %s.","sit","lay an egg");
    }
  }
  if (((youmonst.data)->mflags1 & 0x400000) != 0) {
    learn_egg_type(u.umonnum);
    iVar17 = egg_type_from_parent(u.umonnum,'\x01');
    learn_egg_type(iVar17);
  }
  find_ac();
  if ((((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.ustuck == (monst *)0x0)) &&
       ((u.uprops[0x3c].extrinsic == 0 && (((youmonst.data)->mflags1 & 1) == 0)))) &&
      (((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)) &&
       ((bVar4 = is_pool(level,(int)u.ux,(int)u.uy), bVar4 != '\0' ||
        (bVar4 = is_lava(level,(int)u.ux,(int)u.uy), bVar4 != '\0')))))) ||
     ((((u._1052_1_ & 2) != 0 &&
       (((u.uprops[0x39].intrinsic == 0 && (u.uprops[0x39].extrinsic == 0)) &&
        (((youmonst.data)->mflags1 & 2) == 0)))) &&
      ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 2) == 0)))))) {
    spoteffects('\x01');
  }
  if (((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
      (((youmonst.data)->mflags1 & 8) == 0)) || ((u.utrap == 0 || (u.utraptype != 4)))) {
    if (((youmonst.data != mons + 0x157 && youmonst.data != mons + 0xa0) || (u.utrap == 0)) ||
       (u.utraptype != 3)) goto LAB_00218511;
    pcVar8 = "The lava now feels soothing.";
  }
  else {
    pcVar8 = "The rock seems to no longer trap you.";
  }
  u.utrap = 0;
  pline(pcVar8);
LAB_00218511:
  if ((((((youmonst.data)->mflags1 & 4) != 0) ||
       (youmonst.data == mons + 0x9f || (youmonst.data)->mlet == '\x16')) ||
      (((youmonst.data)->mflags1 >> 0x14 & 1) != 0)) && (uball != (obj *)0x0)) {
    pline("You slip out of the iron chain.");
    unpunish();
  }
  if (((u.utrap != 0) && ((u.utraptype & 0xfffffffd) == 0)) &&
     ((((youmonst.data)->mflags1 & 4) != 0 ||
      ((((((youmonst.data)->mflags1 >> 0x14 & 1) != 0 || ((youmonst.data)->mlet == '\x16')) ||
        (youmonst.data == mons + 0x9f)) || ((u.utraptype == 0 && ((youmonst.data)->msize < 2))))))))
  {
    pline("You are no longer stuck in the %s.");
    u.utrap = 0;
  }
  if (((youmonst.data == mons + 100 || youmonst.data == mons + 0x62) && (u.utrap != 0)) &&
     (u.utraptype == 2)) {
    pline("You orient yourself on the web.");
    u.utrap = 0;
  }
  iflags.botl = '\x01';
  vision_full_recalc = '\x01';
  see_monsters();
  exercise(4,'\0');
  exercise(2,'\x01');
  encumber_msg();
  return 1;
}

Assistant:

int polymon(int mntmp)
{
	boolean sticky = sticks(youmonst.data) && u.ustuck && !u.uswallow,
		was_blind = !!Blind, dochange = FALSE;
	boolean could_pass_walls = Passes_walls;
	int mlvl;

	if (mvitals[mntmp].mvflags & G_GENOD) {	/* allow G_EXTINCT */
		pline("You feel rather %s-ish.", mons_mname(&mons[mntmp]));
		exercise(A_WIS, TRUE);
		return 0;
	}

	/* KMH, conduct */
	u.uconduct.polyselfs++;

	if (!Upolyd) {
		/* Human to monster; save human stats */
		u.macurr = u.acurr;
		u.mamax = u.amax;
		u.mfemale = flags.female;
	} else {
		/* Monster to monster; restore human stats, to be
		 * immediately changed to provide stats for the new monster
		 */
		u.acurr = u.macurr;
		u.amax = u.mamax;
		flags.female = u.mfemale;
	}

	if (youmonst.m_ap_type) {
	    /* stop mimicking immediately */
	    if (multi < 0) unmul("");
	} else if (mons[mntmp].mlet != S_MIMIC) {
	    /* as in polyman() */
	    youmonst.m_ap_type = M_AP_NOTHING;
	}
	if (is_male(&mons[mntmp])) {
		if (flags.female) dochange = TRUE;
	} else if (is_female(&mons[mntmp])) {
		if (!flags.female) dochange = TRUE;
	} else if (!is_neuter(&mons[mntmp]) && mntmp != u.ulycn) {
		if (!rn2(10)) dochange = TRUE;
	}
	if (dochange) {
		flags.female = !flags.female;
		pline("You %s %s%s!",
		    (u.umonnum != mntmp) ? "turn into a" : "feel like a new",
		    (is_male(&mons[mntmp]) || is_female(&mons[mntmp])) ? "" :
			flags.female ? "female " : "male ",
		    mons_mname(&mons[mntmp]));
	} else {
		if (u.umonnum != mntmp)
			pline("You turn into %s!", an(mons_mname(&mons[mntmp])));
		else
			pline("You feel like a new %s!", mons_mname(&mons[mntmp]));
	}
	if (Stoned && poly_when_stoned(&mons[mntmp])) {
		/* poly_when_stoned already checked stone golem genocide */
		pline("You turn to stone!");
		mntmp = PM_STONE_GOLEM;
		Stoned = 0;
		delayed_killer = 0;
	}

	u.mtimedone = rn1(500, 500);
	u.umonnum = mntmp;
	set_uasmon();

	/* New stats for monster, to last only as long as polymorphed.
	 * Currently only strength gets changed.
	 */
	if (strongmonst(&mons[mntmp])) ABASE(A_STR) = AMAX(A_STR) = STR18(100);

	if (Stone_resistance && Stoned) { /* parnes@eniac.seas.upenn.edu */
		Stoned = 0;
		delayed_killer = 0;
		pline("You no longer seem to be petrifying.");
	}
	if (Sick_resistance && Sick) {
		make_sick(0L, NULL, FALSE, SICK_ALL);
		pline("You no longer feel sick.");
	}
	if (Slimed) {
	    if (flaming(youmonst.data)) {
		pline("The slime burns away!");
		Slimed = 0L;
		iflags.botl = 1;
	    } else if (mntmp == PM_GREEN_SLIME) {
		/* do it silently */
		Slimed = 0L;
		iflags.botl = 1;
	    }
	}
	if (nohands(youmonst.data)) Glib = 0;

	/*
	mlvl = adj_lev(&mons[mntmp]);
	 * We can't do the above, since there's no such thing as an
	 * "experience level of you as a monster" for a polymorphed character.
	 */
	mlvl = (int)mons[mntmp].mlevel;
	if (youmonst.data->mlet == S_DRAGON && mntmp >= PM_GRAY_DRAGON) {
		u.mhmax = In_endgame(&u.uz) ? (8*mlvl) : (4*mlvl + dice(mlvl,4));
	} else if (is_golem(youmonst.data)) {
		u.mhmax = golemhp(mntmp);
	} else {
		if (!mlvl) u.mhmax = rnd(4);
		else u.mhmax = dice(mlvl, 8);
		if (is_home_elemental(&u.uz, &mons[mntmp])) u.mhmax *= 3;
	}
	u.mh = u.mhmax;

	if (u.ulevel < mlvl) {
	/* Low level characters can't become high level monsters for long */
		u.mtimedone = u.mtimedone * u.ulevel / mlvl;
	}

	if (uskin && mntmp != armor_to_dragon(uskin->otyp))
		skinback(FALSE);
	break_armor();
	drop_weapon(1);
	if (hides_under(youmonst.data))
		u.uundetected = OBJ_AT(u.ux, u.uy);
	else if (youmonst.data->mlet == S_EEL)
		u.uundetected = is_pool(level, u.ux, u.uy);
	else
		u.uundetected = 0;

	if (u.utraptype == TT_PIT) {
	    if (could_pass_walls && !Passes_walls) {
		u.utrap = rn1(6,2);
	    } else if (!could_pass_walls && Passes_walls) {
		u.utrap = 0;
	    }
	}
	if (was_blind && !Blind) {	/* previous form was eyeless */
	    Blinded = 1L;
	    make_blinded(0L, TRUE);	/* remove blindness */
	}
	newsym(u.ux,u.uy);		/* Change symbol */

	if (!sticky && !u.uswallow && u.ustuck && sticks(youmonst.data)) {
	    u.ustuck = 0;
	    u.uwilldrown = 0;
	} else if (sticky && !sticks(youmonst.data)) {
	    uunstick();
	}

	if (u.usteed) {
	    if (touch_petrifies(u.usteed->data) && !Stone_resistance && rnl(3)) {
		char kbuf[BUFSZ];

		pline("No longer petrifying-resistant, you touch %s.",
				mon_nam(u.usteed));
		sprintf(kbuf, "riding %s", an(mons_mname(u.usteed->data)));
		if (delayed_petrify(NULL, kbuf))
		    dismount_steed(DISMOUNT_FELL);
	    }
	    if (u.usteed && !can_ride(u.usteed))
		dismount_steed(DISMOUNT_POLY);
	}

	if (flags.verbose) {
	    static const char use_thec[] = "Use the command #%s to %s.";
	    static const char monsterc[] = "monster";
	    if (can_breathe(youmonst.data))
		pline(use_thec,monsterc,"use your breath weapon");
	    if (attacktype(youmonst.data, AT_SPIT))
		pline(use_thec,monsterc,"spit venom");
	    if (youmonst.data->mlet == S_NYMPH)
		pline(use_thec,monsterc,"remove an iron ball");
	    if (attacktype(youmonst.data, AT_GAZE))
		pline(use_thec,monsterc,"gaze at monsters");
	    if (is_hider(youmonst.data))
		pline(use_thec,monsterc,"hide");
	    if (is_were(youmonst.data))
		pline(use_thec,monsterc,"summon help");
	    if (webmaker(youmonst.data))
		pline(use_thec,monsterc,"spin a web");
	    if (u.umonnum == PM_GREMLIN)
		pline(use_thec,monsterc,"multiply in a fountain");
	    if (is_unicorn(youmonst.data))
		pline(use_thec,monsterc,"use your horn");
	    if (is_mind_flayer(youmonst.data))
		pline(use_thec,monsterc,"emit a mental blast");
	    if (youmonst.data->msound == MS_SHRIEK) /* worthless, actually */
		pline(use_thec,monsterc,"shriek");
	    if (lays_eggs(youmonst.data) && flags.female)
		pline(use_thec,"sit","lay an egg");
	}
	/* you now know what an egg of your type looks like */
	if (lays_eggs(youmonst.data)) {
	    learn_egg_type(u.umonnum);
	    /* make queen bees recognize killer bee eggs */
	    learn_egg_type(egg_type_from_parent(u.umonnum, TRUE));
	}
	find_ac();
	if ((!Levitation && !u.ustuck && !Flying &&
	    (is_pool(level, u.ux,u.uy) || is_lava(level, u.ux,u.uy))) ||
	   (Underwater && !Swimming))
	    spoteffects(TRUE);
	if (Passes_walls && u.utrap && u.utraptype == TT_INFLOOR) {
	    u.utrap = 0;
	    pline("The rock seems to no longer trap you.");
	} else if (likes_lava(youmonst.data) && u.utrap && u.utraptype == TT_LAVA) {
	    u.utrap = 0;
	    pline("The lava now feels soothing.");
	}
	if (amorphous(youmonst.data) || is_whirly(youmonst.data) || unsolid(youmonst.data)) {
	    if (Punished) {
		pline("You slip out of the iron chain.");
		unpunish();
	    }
	}
	if (u.utrap && (u.utraptype == TT_WEB || u.utraptype == TT_BEARTRAP) &&
		(amorphous(youmonst.data) || is_whirly(youmonst.data) || unsolid(youmonst.data) ||
		  (youmonst.data->msize <= MZ_SMALL && u.utraptype == TT_BEARTRAP))) {
	    pline("You are no longer stuck in the %s.",
		    u.utraptype == TT_WEB ? "web" : "bear trap");
	    /* probably should burn webs too if PM_FIRE_ELEMENTAL */
	    u.utrap = 0;
	}
	if (webmaker(youmonst.data) && u.utrap && u.utraptype == TT_WEB) {
	    pline("You orient yourself on the web.");
	    u.utrap = 0;
	}
	iflags.botl = 1;
	vision_full_recalc = 1;
	see_monsters();
	exercise(A_CON, FALSE);
	exercise(A_WIS, TRUE);
	encumber_msg();
	return 1;
}